

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O2

bool __thiscall zmq::stream_engine_base_t::restart_input(stream_engine_base_t *this)

{
  bool bVar1;
  int iVar2;
  size_t in_RAX;
  int *piVar3;
  ulong uVar4;
  uchar *puVar5;
  code *pcVar6;
  size_t processed;
  
  processed = in_RAX;
  if (this->_input_stopped == false) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_input_stopped",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1a1);
    fflush(_stderr);
    zmq_abort("_input_stopped");
  }
  if (this->_session == (session_base_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_session != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1a2);
    fflush(_stderr);
    zmq_abort("_session != NULL");
  }
  if (this->_decoder == (i_decoder *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_decoder != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1a3);
    fflush(_stderr);
    zmq_abort("_decoder != NULL");
  }
  pcVar6 = (code *)this->_process_msg;
  puVar5 = (this->_options).routing_id + *(long *)&this->field_0x560 + -0x29;
  if (((ulong)pcVar6 & 1) != 0) {
    pcVar6 = *(code **)(pcVar6 + *(long *)puVar5 + -1);
  }
  iVar2 = (*this->_decoder->_vptr_i_decoder[5])();
  iVar2 = (*pcVar6)(puVar5,iVar2);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0xb) goto LAB_0017bb54;
  }
  else {
    do {
      if (this->_insize == 0) {
LAB_0017baee:
        if (this->_io_error == false) {
          this->_input_stopped = false;
          set_pollin(this);
          session_base_t::flush(this->_session);
          bVar1 = in_event_internal(this);
          if (!bVar1) {
            return false;
          }
          return true;
        }
        goto LAB_0017bb44;
      }
      processed = 0;
      iVar2 = (*this->_decoder->_vptr_i_decoder[4])
                        (this->_decoder,this->_inpos,this->_insize,&processed);
      uVar4 = this->_insize;
      if (uVar4 < processed) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","processed <= _insize",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
                ,0x1b3);
        fflush(_stderr);
        zmq_abort("processed <= _insize");
        uVar4 = this->_insize;
      }
      this->_inpos = this->_inpos + processed;
      this->_insize = uVar4 - processed;
      if (iVar2 + 1U < 2) {
        if (iVar2 != -1) goto LAB_0017baee;
        break;
      }
      pcVar6 = (code *)this->_process_msg;
      puVar5 = (this->_options).routing_id + *(long *)&this->field_0x560 + -0x29;
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *(long *)puVar5 + -1);
      }
      iVar2 = (*this->_decoder->_vptr_i_decoder[5])();
      iVar2 = (*pcVar6)(puVar5,iVar2);
    } while (iVar2 != -1);
    piVar3 = __errno_location();
    if (*piVar3 != 0xb) {
      if (this->_io_error == true) {
LAB_0017bb44:
        (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,1);
        return false;
      }
LAB_0017bb54:
      (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,0);
      return false;
    }
  }
  session_base_t::flush(this->_session);
  return true;
}

Assistant:

bool zmq::stream_engine_base_t::restart_input ()
{
    zmq_assert (_input_stopped);
    zmq_assert (_session != NULL);
    zmq_assert (_decoder != NULL);

    int rc = (this->*_process_msg) (_decoder->msg ());
    if (rc == -1) {
        if (errno == EAGAIN)
            _session->flush ();
        else {
            error (protocol_error);
            return false;
        }
        return true;
    }

    while (_insize > 0) {
        size_t processed = 0;
        rc = _decoder->decode (_inpos, _insize, processed);
        zmq_assert (processed <= _insize);
        _inpos += processed;
        _insize -= processed;
        if (rc == 0 || rc == -1)
            break;
        rc = (this->*_process_msg) (_decoder->msg ());
        if (rc == -1)
            break;
    }

    if (rc == -1 && errno == EAGAIN)
        _session->flush ();
    else if (_io_error) {
        error (connection_error);
        return false;
    } else if (rc == -1) {
        error (protocol_error);
        return false;
    }

    else {
        _input_stopped = false;
        set_pollin ();
        _session->flush ();

        //  Speculative read.
        if (!in_event_internal ())
            return false;
    }

    return true;
}